

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

tuple<bool,_float,_cv::Mat> *
removeCollapsnessIfPresent(tuple<bool,_float,_cv::Mat> *__return_storage_ptr__,Mat *inputImg)

{
  _InputArray *p_Var1;
  MatExpr *this;
  double dVar2;
  double dVar3;
  double max;
  double min;
  Mat uncollapsed;
  double local_658;
  double local_650;
  Scalar_<double> local_648;
  MatExpr local_628 [96];
  undefined1 local_5c8 [16];
  Size local_5b8;
  _Head_base<1UL,_double,_false> local_568;
  _Head_base<0UL,_bool,_false> local_560;
  Scalar_<double> local_468;
  MatExpr local_448 [352];
  MatExpr local_2e8 [352];
  Mat local_188 [352];
  
  local_5b8.width = 0;
  local_5b8.height = 0;
  local_5c8._0_4_ = 0x1010000;
  local_5c8._8_8_ = inputImg;
  p_Var1 = (_InputArray *)cv::noArray();
  cv::minMaxLoc((_InputArray *)local_5c8,&local_650,&local_658,(Point_ *)0x0,(Point_ *)0x0,p_Var1);
  dVar2 = (local_658 - local_650) + 1.0;
  dVar3 = dVar2 * 0.00390625 * 100.0;
  if (60.0 <= dVar3) {
    cv::Mat::Mat((Mat *)local_5c8,inputImg);
    local_560._M_head_impl = false;
    local_568._M_head_impl = 100.0 - dVar3;
    std::_Tuple_impl<0ul,bool,float,cv::Mat>::_Tuple_impl<bool,double,cv::Mat>
              ((_Tuple_impl<0ul,bool,float,cv::Mat> *)__return_storage_ptr__,
               (_Tuple_impl<0UL,_bool,_double,_cv::Mat> *)local_5c8);
    this = (MatExpr *)local_5c8;
  }
  else {
    cv::Scalar_<double>::Scalar_(&local_468,local_650);
    cv::operator-(local_188,(Scalar_ *)inputImg);
    cv::operator*(local_448,256.0 / dVar2);
    cv::Scalar_<double>::Scalar_(&local_648,0.0);
    cv::operator+(local_2e8,(Scalar_ *)local_448);
    cv::operator*((MatExpr *)local_5c8,1.15);
    cv::MatExpr::operator_cast_to_Mat(local_628);
    cv::MatExpr::~MatExpr((MatExpr *)local_5c8);
    cv::MatExpr::~MatExpr(local_2e8);
    cv::MatExpr::~MatExpr(local_448);
    cv::MatExpr::~MatExpr((MatExpr *)local_188);
    cv::Mat::Mat((Mat *)local_5c8,(Mat *)local_628);
    local_568._M_head_impl = 100.0 - dVar3;
    local_560._M_head_impl = true;
    std::_Tuple_impl<0ul,bool,float,cv::Mat>::_Tuple_impl<bool,double,cv::Mat>
              ((_Tuple_impl<0ul,bool,float,cv::Mat> *)__return_storage_ptr__,
               (_Tuple_impl<0UL,_bool,_double,_cv::Mat> *)local_5c8);
    cv::Mat::~Mat((Mat *)local_5c8);
    this = local_628;
  }
  cv::Mat::~Mat((Mat *)this);
  return __return_storage_ptr__;
}

Assistant:

tuple<bool,float,Mat> removeCollapsnessIfPresent(Mat const& inputImg) {
    double min, max;

    minMaxLoc(inputImg, &min,&max);
    double spreadnessPercentage = (((max - min) + 1) / 256) * 100;

    if (spreadnessPercentage < 60) {
        double scalingFactor = 256 / ((max - min) + 1);
        double a = 0, c = min;
        Mat uncollapsed = ((inputImg - c) * (scalingFactor) + a)  * 1.15;
        return make_tuple(true, (100 - spreadnessPercentage), uncollapsed);
    }
    return make_tuple(false,(100 - spreadnessPercentage),inputImg);
}